

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O0

Scope * slang::analysis::getAsScope(Symbol *symbol)

{
  InstanceSymbol *this;
  InstanceBodySymbol *pIVar1;
  CheckerInstanceSymbol *pCVar2;
  int *in_RDI;
  InstanceBodySymbol *body;
  InstanceSymbol *inst;
  Scope *local_8;
  
  if (*in_RDI == 0x2f) {
    this = ast::Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x7f8cf0);
    pIVar1 = ast::InstanceSymbol::getCanonicalBody(this);
    if (pIVar1 == (InstanceBodySymbol *)0x0) {
      local_8 = &this->body->super_Scope;
    }
    else {
      local_8 = &pIVar1->super_Scope;
    }
  }
  else if (*in_RDI == 0x57) {
    pCVar2 = ast::Symbol::as<slang::ast::CheckerInstanceSymbol>((Symbol *)0x7f8d3a);
    local_8 = &pCVar2->body->super_Scope;
  }
  else {
    local_8 = ast::Symbol::as<slang::ast::Scope>((Symbol *)0x7f8d53);
  }
  return local_8;
}

Assistant:

static const Scope& getAsScope(const Symbol& symbol) {
    switch (symbol.kind) {
        case SymbolKind::Instance: {
            auto& inst = symbol.as<InstanceSymbol>();
            if (auto body = inst.getCanonicalBody())
                return *body;
            return inst.body;
        }
        case SymbolKind::CheckerInstance:
            return symbol.as<CheckerInstanceSymbol>().body;
        default:
            return symbol.as<Scope>();
    }
}